

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64 drwav_read_pcm_frames_be(drwav *pWav,drwav_uint64 framesToRead,void *pBufferOut)

{
  ushort *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  ulong uVar4;
  drwav_uint32 dVar5;
  uint uVar6;
  drwav_uint64 iSample;
  drwav_uint64 dVar7;
  long lVar8;
  anon_union_8_2_947300a4 x;
  undefined1 *puVar9;
  long lVar10;
  bool bVar11;
  
  dVar7 = drwav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
  if (pBufferOut != (void *)0x0) {
    uVar3 = pWav->channels;
    lVar10 = dVar7 * uVar3;
    dVar5 = drwav_get_bytes_per_pcm_frame(pWav);
    uVar6 = dVar5 / uVar3;
    uVar3 = pWav->translatedFormatTag;
    if (uVar3 - 6 < 2) {
      for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
        puVar1 = (ushort *)((long)pBufferOut + lVar8 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      }
    }
    else if (uVar3 == 1) {
      if (uVar6 == 2) {
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          puVar1 = (ushort *)((long)pBufferOut + lVar8 * 2);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        }
      }
      else if (uVar6 == 3) {
        puVar9 = (undefined1 *)((long)pBufferOut + 2);
        while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
          uVar2 = puVar9[-2];
          puVar9[-2] = *puVar9;
          *puVar9 = uVar2;
          puVar9 = puVar9 + 3;
        }
      }
      else {
        if (uVar6 != 4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                        ,0x553,"void drwav__bswap_samples_pcm(void *, drwav_uint64, drwav_uint32)");
        }
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          uVar6 = *(uint *)((long)pBufferOut + lVar8 * 4);
          *(uint *)((long)pBufferOut + lVar8 * 4) =
               uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        }
      }
    }
    else {
      if (uVar3 != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                      ,0x58b,
                      "void drwav__bswap_samples(void *, drwav_uint64, drwav_uint32, drwav_uint16)")
        ;
      }
      if (uVar6 == 4) {
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          uVar6 = *(uint *)((long)pBufferOut + lVar8 * 4);
          *(uint *)((long)pBufferOut + lVar8 * 4) =
               uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        }
      }
      else {
        if (uVar6 != 8) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                        ,0x56d,"void drwav__bswap_samples_ieee(void *, drwav_uint64, drwav_uint32)")
          ;
        }
        for (lVar8 = 0; lVar10 - lVar8 != 0; lVar8 = lVar8 + 1) {
          uVar4 = *(ulong *)((long)pBufferOut + lVar8 * 8);
          *(ulong *)((long)pBufferOut + lVar8 * 8) =
               uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
               | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 |
               (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
        }
      }
    }
  }
  return dVar7;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_be(drwav* pWav, drwav_uint64 framesToRead, void* pBufferOut)
{
    drwav_uint64 framesRead = drwav_read_pcm_frames_le(pWav, framesToRead, pBufferOut);

    if (pBufferOut != NULL) {
        drwav__bswap_samples(pBufferOut, framesRead*pWav->channels, drwav_get_bytes_per_pcm_frame(pWav)/pWav->channels, pWav->translatedFormatTag);
    }

    return framesRead;
}